

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml2-py.c
# Opt level: O0

PyObject * libxml_xmlSetCompressMode(PyObject *self,PyObject *args)

{
  int iVar1;
  undefined4 local_24;
  PyObject *pPStack_20;
  int mode;
  PyObject *args_local;
  PyObject *self_local;
  
  pPStack_20 = args;
  args_local = self;
  iVar1 = libxml_deprecationWarning("xmlSetCompressMode");
  if (iVar1 == -1) {
    self_local = (PyObject *)0x0;
  }
  else {
    iVar1 = _PyArg_ParseTuple_SizeT(pPStack_20,"i:xmlSetCompressMode",&local_24);
    if (iVar1 == 0) {
      self_local = (PyObject *)0x0;
    }
    else {
      xmlSetCompressMode(local_24);
      _Py_INCREF((PyObject *)&_Py_NoneStruct);
      self_local = (PyObject *)&_Py_NoneStruct;
    }
  }
  return self_local;
}

Assistant:

XML_IGNORE_DEPRECATION_WARNINGS
PyObject *
libxml_xmlSetCompressMode(PyObject *self ATTRIBUTE_UNUSED, PyObject *args) {
    int mode;

    if (libxml_deprecationWarning("xmlSetCompressMode") == -1)
        return(NULL);

    if (!PyArg_ParseTuple(args, (char *)"i:xmlSetCompressMode", &mode))
        return(NULL);

    xmlSetCompressMode(mode);
    Py_INCREF(Py_None);
    return(Py_None);
}